

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DMovePolyTo::DMovePolyTo(DMovePolyTo *this,int polyNum)

{
  TVector2<double> *other;
  TVector2<double> local_38 [2];
  int local_14;
  DMovePolyTo *pDStack_10;
  int polyNum_local;
  DMovePolyTo *this_local;
  
  local_14 = polyNum;
  pDStack_10 = this;
  DPolyAction::DPolyAction(&this->super_DPolyAction,polyNum);
  (this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6e1f8;
  TVector2<double>::TVector2(&this->m_Speedv);
  TVector2<double>::TVector2(&this->m_Target);
  TVector2<double>::TVector2(local_38,0.0,0.0);
  other = TVector2<double>::operator=(&this->m_Target,local_38);
  TVector2<double>::operator=(&this->m_Speedv,other);
  return;
}

Assistant:

DMovePolyTo::DMovePolyTo(int polyNum)
	: Super(polyNum)
{
	m_Speedv = m_Target = { 0,0 };
}